

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datafile.c
# Opt level: O3

errr get_rnd_line(char *file_name,char *output)

{
  _Bool _Var1;
  uint32_t uVar2;
  ang_file *f;
  errr eVar3;
  int iVar4;
  char buf [1024];
  char acStack_428 [1024];
  
  path_build(acStack_428,0x400,ANGBAND_DIR_GAMEDATA,file_name);
  eVar3 = 1;
  f = file_open(acStack_428,MODE_READ,FTYPE_TEXT);
  if (f == (ang_file *)0x0) {
    eVar3 = -1;
  }
  else {
    _Var1 = file_getl(f,acStack_428,0x50);
    if (_Var1) {
      uVar2 = atoi(acStack_428);
      uVar2 = Rand_div(uVar2);
      if ((int)uVar2 < -1) {
LAB_00138a53:
        strcpy(output,acStack_428);
        file_close(f);
        eVar3 = 0;
      }
      else {
        _Var1 = file_getl(f,acStack_428,0x50);
        if (_Var1) {
          iVar4 = uVar2 + 2;
          do {
            iVar4 = iVar4 + -1;
            if (iVar4 == 0) goto LAB_00138a53;
            _Var1 = file_getl(f,acStack_428,0x50);
          } while (_Var1);
        }
      }
    }
  }
  return eVar3;
}

Assistant:

errr get_rnd_line(const char *file_name, char *output)
{
	ang_file *fp;
	char buf[1024];
	int lines = 0, line, counter;

	/* Build the filename */
	path_build(buf, 1024, ANGBAND_DIR_GAMEDATA, file_name);

	/* Open the file */
	fp = file_open(buf, MODE_READ, FTYPE_TEXT);

	/* Failed */
	if (!fp)
		return (-1);

	/* Parse the file */
	if (file_getl(fp, buf, 80))
		lines = atoi(buf);
	else
		return (1);

	/* choose a random line */
	line = randint1(lines);

	for (counter = 0; counter <= line; counter++) {
		if (!(file_getl(fp, buf, 80)))
			return (1);
		else if (counter == line)
			break;
	}

	strcpy(output, buf);

	/* Close the file */
	file_close(fp);

	return (0);
}